

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

cf_bool_t cf_array_insert(cf_array_t *self,int index,cf_void_t *elm,cf_size_t size)

{
  cf_void_t *pcVar1;
  long lVar2;
  cf_size_t cVar3;
  cf_bool_t cVar4;
  ulong uVar5;
  
  if (self->elm_size < size) {
    __assert_fail("size <= self->elm_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/array.c"
                  ,0x38,"cf_bool_t cf_array_insert(cf_array_t *, int, cf_void_t *, cf_size_t)");
  }
  cVar4 = 0;
  if ((-2 < index) && (cVar3 = self->elm_count, index <= (int)cVar3)) {
    if (cVar3 == self->capacity) {
      cVar3 = self->elm_size * cVar3 * 2;
      pcVar1 = cf_malloc_dbg(cVar3,0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/array.c"
                             ,"cf_array_insert",0x42);
      if (pcVar1 == (cf_void_t *)0x0) {
        return 0;
      }
      cf_memcpy_s(pcVar1,cVar3,self->elm_start,self->elm_size * self->elm_count);
      cf_free_dbg(self->elm_start,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/array.c"
                  ,"cf_array_insert",0x48);
      self->elm_start = pcVar1;
      self->capacity = self->capacity << 1;
    }
    if (index == -1) {
      cVar3 = self->elm_size;
      pcVar1 = (cf_void_t *)(self->elm_count * cVar3 + (long)self->elm_start);
    }
    else {
      uVar5 = (ulong)(uint)self->elm_count;
      while( true ) {
        cVar3 = self->elm_size;
        pcVar1 = self->elm_start;
        if ((int)uVar5 <= index) break;
        lVar2 = uVar5 * cVar3;
        uVar5 = (ulong)((int)uVar5 - 1);
        cf_memcpy_s((cf_void_t *)(lVar2 + (long)pcVar1),cVar3,
                    (cf_void_t *)(uVar5 * cVar3 + (long)pcVar1),cVar3);
      }
      pcVar1 = (cf_void_t *)((long)pcVar1 + (uint)index * cVar3);
    }
    cf_memcpy_s(pcVar1,cVar3,elm,cVar3);
    self->elm_count = self->elm_count + 1;
    cVar4 = 1;
  }
  return cVar4;
}

Assistant:

cf_bool_t cf_array_insert(cf_array_t* self, int index, cf_void_t* elm, cf_size_t size) {
    int i;
    cf_size_t new_memory_size = 0;
    cf_void_t* new_memory = CF_NULL_PTR;
    
    cf_assert(size <= self->elm_size);

    // out of range
    if (index < CF_ARRAY_END_INDEX || index > CF_TYPE_CAST(int, self->elm_count)) {
        return CF_FALSE;
    }

    // expand
    if (self->elm_count == self->capacity) {
        new_memory_size = self->elm_size * self->capacity * 2;
        new_memory = cf_malloc(new_memory_size);
        if (new_memory == CF_NULL_PTR) {
            return CF_FALSE;
        }
        cf_memcpy_s(new_memory, new_memory_size, self->elm_start, self->elm_count * self->elm_size);

        cf_free(self->elm_start);
        self->elm_start = new_memory;
        self->capacity *= 2;
    }

    // append to last
    if (index == CF_ARRAY_END_INDEX) {
        cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * self->elm_count,
            self->elm_size,
            elm,
            self->elm_size);
        self->elm_count += 1;
        return CF_TRUE;
    }

    i = index;
    for (i = self->elm_count; i > index; i--) {
        cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * i,
            self->elm_size,
            (cf_uint8_t*)self->elm_start + self->elm_size * (i - 1),
            self->elm_size);
    }
    cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * index,
            self->elm_size,
            elm,
            self->elm_size);
    self->elm_count += 1;

    return CF_TRUE;
}